

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O1

SVInt slang::SVInt::fromPow2Digits
                (bitwidth_t bits,bool isSigned,bool anyUnknown,uint32_t radix,uint32_t shift,
                span<const_slang::logic_t,_18446744073709551615UL> digits)

{
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 *paVar1;
  uint64_t uVar2;
  bitwidth_t bVar3;
  bool bVar4;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 *__s;
  ulong uVar5;
  invalid_argument *this;
  bool bVar6;
  byte bVar7;
  uint uVar8;
  ulong uVar9;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  undefined7 in_register_00000031;
  uint uVar10;
  undefined4 in_register_0000003c;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 this_00;
  __extent_storage<18446744073709551615UL> _Var11;
  value<fmt::v11::context> *pvVar12;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 aVar13;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 aVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  string_view fmt;
  format_args args;
  SVInt SVar19;
  string local_78;
  ulong local_58 [2];
  uint32_t local_48;
  
  this_00.val._4_4_ = in_register_0000003c;
  this_00.val._0_4_ = bits;
  bVar3 = (bitwidth_t)CONCAT71(in_register_00000031,isSigned);
  uVar17 = bVar3 + 0x3f >> 6;
  bVar6 = SUB41(radix,0);
  uVar5 = (ulong)((uVar17 << (bVar6 & 0x1fU)) << 3);
  aVar13 = in_R9;
  __s = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 *)operator_new__(uVar5);
  uVar16 = 0;
  memset(__s,0,uVar5);
  *(anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 **)this_00 = __s;
  *(bitwidth_t *)(this_00.val + 8) = bVar3;
  *(bool *)(this_00.val + 0xc) = anyUnknown;
  *(bool *)(this_00.val + 0xd) = bVar6;
  uVar5 = (ulong)(uint)~(-1 << (in_R9._0_1_ & 0x1f));
  paVar1 = __s + uVar17;
  _Var11 = digits._M_extent._M_extent_value;
  pvVar12 = (value<fmt::v11::context> *)0x0;
  aVar14.values_ = (value<fmt::v11::context> *)0x0;
  do {
    if ((long)_Var11._M_extent_value < 1) break;
    bVar7 = digits._M_ptr[_Var11._M_extent_value - 1].value;
    uVar18 = uVar5;
    if (bVar7 == 0x80) {
      uVar9 = 0;
    }
    else {
      uVar9 = uVar5;
      if (bVar7 != 0x40) {
        if (shift <= bVar7) {
          this = (invalid_argument *)__cxa_allocate_exception(0x10);
          fmt.size_ = 0x24;
          fmt.data_ = (char *)0x1f;
          args.field_1.args_ = aVar13.args_;
          args.desc_ = (unsigned_long_long)local_58;
          local_58[0] = (ulong)bVar7;
          local_48 = shift;
          ::fmt::v11::vformat_abi_cxx11_
                    (&local_78,(v11 *)"Digit {} too large for radix {}",fmt,args);
          std::invalid_argument::invalid_argument(this,(string *)&local_78);
          __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument
                     );
        }
        uVar9 = (ulong)bVar7;
        uVar18 = 0;
      }
    }
    aVar13.args_ = uVar9 << ((byte)uVar16 & 0x3f) | aVar14.args_;
    pvVar12 = (value<fmt::v11::context> *)(uVar18 << ((byte)uVar16 & 0x3f) | (ulong)pvVar12);
    uVar16 = uVar16 + in_R9._0_4_;
    bVar4 = true;
    if (0x3f < uVar16) {
      __s->values_ = (value<fmt::v11::context> *)aVar13;
      if (bVar6 != false) {
        __s[uVar17].values_ = pvVar12;
      }
      __s = __s + 1;
      if (__s == paVar1) {
        bVar4 = false;
      }
      else {
        uVar16 = uVar16 - 0x40;
        bVar7 = in_R9._0_1_ - (char)uVar16;
        aVar13.values_ = (value<fmt::v11::context> *)(uVar9 >> (bVar7 & 0x3f));
        pvVar12 = (value<fmt::v11::context> *)(uVar18 >> (bVar7 & 0x3f));
      }
    }
    _Var11._M_extent_value = _Var11._M_extent_value - 1;
    aVar14 = aVar13;
  } while (bVar4);
  if (__s != paVar1) {
    if (aVar14.values_ != (value<fmt::v11::context> *)0x0) {
      __s->values_ = (value<fmt::v11::context> *)aVar14;
    }
    if ((bVar6 != false) && (pvVar12 != (value<fmt::v11::context> *)0x0)) {
      __s[uVar17].values_ = pvVar12;
    }
  }
  clearUnusedBits((SVInt *)this_00.pVal);
  checkUnknown((SVInt *)this_00.pVal);
  uVar5 = extraout_RDX;
  if (*(bool *)(this_00.val + 0xd) == true) {
    uVar16 = in_R9._0_4_ * (int)digits._M_extent._M_extent_value;
    if (*(bitwidth_t *)(this_00.val + 8) < uVar16) {
      uVar16 = *(bitwidth_t *)(this_00.val + 8);
    }
    uVar8 = uVar16 & 0x3f;
    uVar18 = 0;
    bVar7 = 0x3f;
    if (uVar8 != 0) {
      uVar18 = -1L << (sbyte)uVar8;
      bVar7 = (sbyte)uVar8 - 1;
    }
    uVar8 = (uint)(uVar8 == 0);
    uVar15 = (uVar16 >> 6) - uVar8;
    uVar10 = uVar15 + uVar17;
    uVar2 = *this_00.pVal;
    uVar5 = *(ulong *)(uVar2 + (ulong)uVar10 * 8);
    if (uVar5 >> (bVar7 & 0x3f) != 0) {
      *(ulong *)(uVar2 + (ulong)uVar10 * 8) = uVar5 | uVar18;
      if (uVar10 + 1 < uVar17 * 2) {
        memset((void *)((ulong)(uVar10 + 1) * 8 + uVar2),0xff,(ulong)((uVar17 - uVar15) - 2) * 8 + 8
              );
      }
      uVar5 = *(ulong *)(uVar2 + (ulong)uVar15 * 8);
      if (uVar5 >> (bVar7 & 0x3f) != 0) {
        *(ulong *)(uVar2 + (ulong)uVar15 * 8) = uVar5 | uVar18;
        if (uVar15 + 1 < uVar17) {
          memset((void *)((ulong)(uVar15 + 1) * 8 + uVar2),0xff,
                 (ulong)((uVar17 - ((uVar16 >> 6) - uVar8)) - 2) * 8 + 8);
        }
      }
      clearUnusedBits((SVInt *)this_00.pVal);
      uVar5 = extraout_RDX_00;
    }
  }
  SVar19.super_SVIntStorage.bitWidth = (int)uVar5;
  SVar19.super_SVIntStorage.signFlag = (bool)(char)(uVar5 >> 0x20);
  SVar19.super_SVIntStorage.unknownFlag = (bool)(char)(uVar5 >> 0x28);
  SVar19.super_SVIntStorage._14_2_ = (short)(uVar5 >> 0x30);
  SVar19.super_SVIntStorage.field_0.val = this_00.val;
  return (SVInt)SVar19.super_SVIntStorage;
}

Assistant:

SVInt SVInt::fromPow2Digits(bitwidth_t bits, bool isSigned, bool anyUnknown, uint32_t radix,
                            uint32_t shift, std::span<logic_t const> digits) {

    SVInt result = allocZeroed(bits, isSigned, anyUnknown);

    uint32_t numWords = getNumWords(bits, false);
    uint32_t ones = (1 << shift) - 1;
    uint64_t word = 0;
    uint64_t unknownWord = 0;
    uint64_t* dest = result.pVal;
    uint64_t* endPtr = dest + numWords;
    uint32_t bitPos = 0;

    for (ptrdiff_t i = ptrdiff_t(digits.size()) - 1; i >= 0; i--) {
        logic_t d = digits[size_t(i)];
        uint64_t unknown = 0;
        uint64_t value = d.value;

        if (exactlyEqual(d, logic_t::x)) {
            value = 0;
            unknown = ones;
        }
        else if (exactlyEqual(d, logic_t::z)) {
            value = ones;
            unknown = ones;
        }
        else if (value >= radix) {
            SLANG_THROW(std::invalid_argument(
                fmt::format("Digit {} too large for radix {}", value, radix)));
        }

        word |= value << bitPos;
        unknownWord |= unknown << bitPos;
        bitPos += shift;

        if (bitPos >= BITS_PER_WORD) {
            *dest = word;
            if (anyUnknown)
                *(dest + numWords) = unknownWord;

            dest++;
            if (dest == endPtr)
                break;

            bitPos -= BITS_PER_WORD;
            word = value >> (shift - bitPos);
            unknownWord = unknown >> (shift - bitPos);
        }
    }

    if (dest != endPtr) {
        if (word)
            *dest = word;
        if (anyUnknown && unknownWord)
            *(dest + numWords) = unknownWord;
    }

    result.clearUnusedBits();
    result.checkUnknown();

    if (result.hasUnknown()) {
        // If the most significant bit is X or Z, we need to extend that out to the full range.
        uint32_t givenBits = std::min((uint32_t)digits.size() * shift, result.getBitWidth());
        uint32_t wordBits = givenBits % BITS_PER_WORD;
        uint32_t wordOffset = givenBits / BITS_PER_WORD;
        uint64_t mask = UINT64_MAX;
        if (wordBits)
            mask <<= wordBits;
        else {
            wordBits = 64;
            wordOffset--;
            mask = 0;
        }

        uint32_t topWord = numWords + wordOffset;
        if (result.pVal[topWord] >> (wordBits - 1)) {
            // Unknown bit was set, so now do the extension.
            result.pVal[topWord] |= mask;
            for (topWord++; topWord < numWords * 2; topWord++)
                result.pVal[topWord] = UINT64_MAX;

            if (result.pVal[wordOffset] >> (wordBits - 1)) {
                // The Z bit was set as well, so handle that too.
                result.pVal[wordOffset] |= mask;
                for (wordOffset++; wordOffset < numWords; wordOffset++)
                    result.pVal[wordOffset] = UINT64_MAX;
            }
            result.clearUnusedBits();
        }
    }

    return result;
}